

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_9bdda5::HandleFindCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  cmMakefile *this;
  bool bVar1;
  bool bVar2;
  pointer pbVar3;
  unsigned_long __val;
  pointer pbVar4;
  string_view value;
  string_view value_00;
  allocator<char> local_49;
  string local_48;
  
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (((long)pbVar3 - (long)pbVar4 >> 5) - 6U < 0xfffffffffffffffe) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"sub-command FIND requires 3 or 4 parameters.",&local_49);
    std::__cxx11::string::_M_assign((string *)&status->Error);
LAB_00274e96:
    std::__cxx11::string::~string((string *)&local_48);
    return false;
  }
  if ((long)pbVar3 - (long)pbVar4 == 0xa0) {
    bVar1 = std::operator==(pbVar4 + 4,"REVERSE");
    pbVar4 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pbVar3 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    bVar1 = false;
  }
  if ((long)pbVar3 - (long)pbVar4 == 0xa0) {
    bVar2 = std::operator!=(pbVar4 + 4,"REVERSE");
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"sub-command FIND: unknown last parameter",&local_49);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      goto LAB_00274e96;
    }
    pbVar4 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  }
  __lhs = pbVar4 + 3;
  bVar2 = std::operator==(__lhs,"REVERSE");
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,
               "sub-command FIND does not allow one to select REVERSE as the output variable.  Maybe you missed the actual output variable?"
               ,&local_49);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    if (bVar1 == false) {
      __val = std::__cxx11::string::find((string *)(pbVar4 + 1),(ulong)(pbVar4 + 2));
    }
    else {
      __val = std::__cxx11::string::rfind((string *)(pbVar4 + 1),(ulong)(pbVar4 + 2));
    }
    this = status->Makefile;
    if (__val == 0xffffffffffffffff) {
      value_00._M_str = "-1";
      value_00._M_len = 2;
      cmMakefile::AddDefinition(this,__lhs,value_00);
      goto LAB_00274fc1;
    }
    std::__cxx11::to_string(&local_48,__val);
    value._M_str = local_48._M_dataplus._M_p;
    value._M_len = local_48._M_string_length;
    cmMakefile::AddDefinition(this,__lhs,value);
  }
  std::__cxx11::string::~string((string *)&local_48);
LAB_00274fc1:
  return !bVar2;
}

Assistant:

bool HandleFindCommand(std::vector<std::string> const& args,
                       cmExecutionStatus& status)
{
  // check if all required parameters were passed
  if (args.size() < 4 || args.size() > 5) {
    status.SetError("sub-command FIND requires 3 or 4 parameters.");
    return false;
  }

  // check if the reverse flag was set or not
  bool reverseMode = false;
  if (args.size() == 5 && args[4] == "REVERSE") {
    reverseMode = true;
  }

  // if we have 5 arguments the last one must be REVERSE
  if (args.size() == 5 && args[4] != "REVERSE") {
    status.SetError("sub-command FIND: unknown last parameter");
    return false;
  }

  // local parameter names.
  const std::string& sstring = args[1];
  const std::string& schar = args[2];
  const std::string& outvar = args[3];

  // ensure that the user cannot accidentally specify REVERSE as a variable
  if (outvar == "REVERSE") {
    status.SetError("sub-command FIND does not allow one to select REVERSE as "
                    "the output variable.  "
                    "Maybe you missed the actual output variable?");
    return false;
  }

  // try to find the character and return its position
  size_t pos;
  if (!reverseMode) {
    pos = sstring.find(schar);
  } else {
    pos = sstring.rfind(schar);
  }
  if (std::string::npos != pos) {
    status.GetMakefile().AddDefinition(outvar, std::to_string(pos));
    return true;
  }

  // the character was not found, but this is not really an error
  status.GetMakefile().AddDefinition(outvar, "-1");
  return true;
}